

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O3

void __thiscall
cmLocalGenerator::AppendCompileOptions
          (cmLocalGenerator *this,
          vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *options,vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *options_vec,char *regex)

{
  pointer pBVar1;
  bool bVar2;
  pointer pBVar3;
  string flag;
  RegularExpression r;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  undefined1 local_100 [176];
  char *local_50;
  char *local_40;
  int local_38;
  
  if (regex == (char *)0x0) {
    pBVar3 = (options_vec->
             super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pBVar1 = (options_vec->
             super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if (pBVar3 != pBVar1) {
      do {
        local_100._8_8_ = (char *)0x0;
        local_100[0x10] = '\0';
        local_100._0_8_ = local_100 + 0x10;
        (*this->_vptr_cmLocalGenerator[8])
                  (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_100,pBVar3);
        std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
        emplace_back<std::__cxx11::string,cmListFileBacktrace_const&>
                  ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
                   options,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_100,&pBVar3->Backtrace);
        if ((undefined1 *)local_100._0_8_ != local_100 + 0x10) {
          operator_delete((void *)local_100._0_8_,CONCAT71(local_100._17_7_,local_100[0x10]) + 1);
        }
        pBVar3 = pBVar3 + 1;
      } while (pBVar3 != pBVar1);
    }
  }
  else {
    local_50 = (char *)0x0;
    local_40 = (char *)0x0;
    local_38 = 0;
    memset((RegularExpression *)local_100,0,0xaa);
    cmsys::RegularExpression::compile((RegularExpression *)local_100,regex);
    pBVar3 = (options_vec->
             super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pBVar1 = (options_vec->
             super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if (pBVar3 != pBVar1) {
      do {
        bVar2 = cmsys::RegularExpression::find
                          ((RegularExpression *)local_100,(pBVar3->Value)._M_dataplus._M_p,
                           (RegularExpressionMatch *)local_100);
        if (bVar2) {
          local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
          local_120._M_string_length = 0;
          local_120.field_2._M_local_buf[0] = '\0';
          (*this->_vptr_cmLocalGenerator[8])(this,&local_120,pBVar3);
          std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
          emplace_back<std::__cxx11::string,cmListFileBacktrace_const&>
                    ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
                     options,&local_120,&pBVar3->Backtrace);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_120._M_dataplus._M_p != &local_120.field_2) {
            operator_delete(local_120._M_dataplus._M_p,
                            CONCAT71(local_120.field_2._M_allocated_capacity._1_7_,
                                     local_120.field_2._M_local_buf[0]) + 1);
          }
        }
        pBVar3 = pBVar3 + 1;
      } while (pBVar3 != pBVar1);
    }
    if (local_40 != (char *)0x0) {
      operator_delete__(local_40);
    }
  }
  return;
}

Assistant:

void cmLocalGenerator::AppendCompileOptions(
  std::vector<BT<std::string>>& options,
  const std::vector<BT<std::string>>& options_vec, const char* regex) const
{
  if (regex != nullptr) {
    // Filter flags upon specified regular expressions.
    cmsys::RegularExpression r(regex);

    for (BT<std::string> const& opt : options_vec) {
      if (r.find(opt.Value)) {
        std::string flag;
        this->AppendFlagEscape(flag, opt.Value);
        options.emplace_back(std::move(flag), opt.Backtrace);
      }
    }
  } else {
    for (BT<std::string> const& opt : options_vec) {
      std::string flag;
      this->AppendFlagEscape(flag, opt.Value);
      options.emplace_back(std::move(flag), opt.Backtrace);
    }
  }
}